

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall hdc::Parser::match(Parser *this,TokenKind kind)

{
  Token *this_00;
  TokenKind TVar1;
  TokenKind TVar2;
  
  TVar1 = Token::getKind((this->current_token)._M_current);
  if (TVar1 == kind) {
    this_00 = (this->current_token)._M_current;
    (this->matched)._M_current = this_00;
    TVar2 = Token::getKind(this_00);
    if (TVar2 != TK_EOF) {
      (this->current_token)._M_current = (this->current_token)._M_current + 1;
    }
  }
  return TVar1 == kind;
}

Assistant:

bool Parser::match(TokenKind kind) {
    if (lookahead(kind)) {
        matched = current_token;
        advance();
        return true;
    }

    return false;
}